

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdEval(uint *pTruth,int nVars,int nLutSize)

{
  int iVar1;
  int iVar2;
  Kit_DsdNtk_t *pNtk_00;
  Kit_DsdMan_t *p_00;
  uint *pIn1;
  int Result;
  uint *pTruthC;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdMan_t *p;
  int nLutSize_local;
  int nVars_local;
  uint *pTruth_local;
  
  pNtk_00 = Kit_DsdDecompose(pTruth,nVars);
  iVar1 = Kit_DsdCountLuts(pNtk_00,nLutSize);
  iVar2 = Kit_DsdNtkObjNum(pNtk_00);
  p_00 = Kit_DsdManAlloc(nVars,iVar2);
  pIn1 = Kit_DsdTruthCompute(p_00,pNtk_00);
  iVar2 = Kit_TruthIsEqual(pTruth,pIn1,nVars);
  if (iVar2 == 0) {
    printf("Verification failed.\n");
  }
  Kit_DsdManFree(p_00);
  Kit_DsdNtkFree(pNtk_00);
  return iVar1;
}

Assistant:

int Kit_DsdEval( unsigned * pTruth, int nVars, int nLutSize )
{
    Kit_DsdMan_t * p;
    Kit_DsdNtk_t * pNtk;
    unsigned * pTruthC;
    int Result;

    // decompose the function
    pNtk = Kit_DsdDecompose( pTruth, nVars );
    Result = Kit_DsdCountLuts( pNtk, nLutSize );
//    printf( "\n" );
//    Kit_DsdPrint( stdout, pNtk );
//    printf( "Eval = %d.\n", Result );

    // recompute the truth table
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
    if ( !Kit_TruthIsEqual( pTruth, pTruthC, nVars ) )
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );

    Kit_DsdNtkFree( pNtk );
    return Result;
}